

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O3

double __thiscall wasm::Literal::copysign(Literal *this,double __x,double __y)

{
  int iVar1;
  uint uVar2;
  ulong *in_RDX;
  Literal *ret;
  ulong *in_RSI;
  double extraout_XMM0_Qa;
  anon_union_16_5_9943fe1e_for_Literal_0 local_28;
  undefined8 local_18;
  
  if (6 < in_RSI[2]) {
    __assert_fail("isBasic() && \"Basic type expected\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-type.h"
                  ,0xc6,"BasicType wasm::Type::getBasic() const");
  }
  iVar1 = (int)in_RSI[2];
  if (iVar1 == 5) {
    local_28.func.super_IString.str._M_len =
         *in_RDX & 0x8000000000000000 | *in_RSI & 0x7fffffffffffffff;
    local_18 = 3;
    (this->type).id = 5;
    (this->field_0).func.super_IString.str._M_len = local_28.i64;
  }
  else {
    if (iVar1 != 4) {
      handle_unreachable("unexpected type",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm/literal.cpp"
                         ,0x627);
    }
    uVar2 = (uint)*in_RDX & 0x80000000 | (uint)*in_RSI & 0x7fffffff;
    local_28.i32 = uVar2;
    local_18 = 2;
    (this->type).id = 4;
    (this->field_0).i32 = uVar2;
  }
  ~Literal((Literal *)&local_28.func);
  return extraout_XMM0_Qa;
}

Assistant:

Literal Literal::copysign(const Literal& other) const {
  // operate on bits directly, to avoid signalling bit being set on a float
  switch (type.getBasic()) {
    case Type::f32:
      return Literal((i32 & 0x7fffffff) | (other.i32 & 0x80000000)).castToF32();
      break;
    case Type::f64:
      return Literal((i64 & 0x7fffffffffffffffUL) |
                     (other.i64 & 0x8000000000000000UL))
        .castToF64();
      break;
    default:
      WASM_UNREACHABLE("unexpected type");
  }
}